

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O0

GLFWbool refreshVideoModes(_GLFWmonitor *monitor)

{
  GLFWvidmode *__base;
  long in_RDI;
  GLFWvidmode *modes;
  int modeCount;
  _GLFWmonitor *in_stack_00000020;
  int local_14;
  GLFWbool local_4;
  
  if (*(long *)(in_RDI + 0x20) == 0) {
    __base = _glfwPlatformGetVideoModes(in_stack_00000020,(int *)monitor);
    if (__base == (GLFWvidmode *)0x0) {
      local_4 = 0;
    }
    else {
      qsort(__base,(long)local_14,0x18,compareVideoModes);
      free(*(void **)(in_RDI + 0x20));
      *(GLFWvidmode **)(in_RDI + 0x20) = __base;
      *(int *)(in_RDI + 0x28) = local_14;
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static GLFWbool refreshVideoModes(_GLFWmonitor* monitor)
{
    int modeCount;
    GLFWvidmode* modes;

    if (monitor->modes)
        return GLFW_TRUE;

    modes = _glfwPlatformGetVideoModes(monitor, &modeCount);
    if (!modes)
        return GLFW_FALSE;

    qsort(modes, modeCount, sizeof(GLFWvidmode), compareVideoModes);

    free(monitor->modes);
    monitor->modes = modes;
    monitor->modeCount = modeCount;

    return GLFW_TRUE;
}